

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.h
# Opt level: O1

int __thiscall LParser::accept(LParser *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined8 *puVar1;
  undefined4 in_register_00000034;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28,CONCAT44(in_register_00000034,__fd));
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"ACCEPT","");
  *puVar1 = &PTR__LParserException_00122578;
  puVar1[1] = puVar1 + 3;
  puVar1[2] = 0;
  *(undefined1 *)(puVar1 + 3) = 0;
  std::__cxx11::string::operator=((string *)(puVar1 + 1),(string *)local_38);
  __cxa_throw(puVar1,&LParserException::typeinfo,LParserException::~LParserException);
}

Assistant:

void accept() {
        throw LParserException("ACCEPT");
    }